

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

void R_SetupSpanBits(FTexture *tex)

{
  byte bVar1;
  
  ds_xbits = (int)tex->WidthBits;
  bVar1 = tex->HeightBits;
  ds_ybits = (int)bVar1;
  if ((int)(uint)tex->Width < 1 << (tex->WidthBits & 0x1f)) {
    ds_xbits = ds_xbits - 1;
  }
  if ((int)(uint)tex->Height < 1 << (bVar1 & 0x1f)) {
    ds_ybits = bVar1 - 1;
  }
  return;
}

Assistant:

int GetWidth () { return Width; }